

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixIO.cpp
# Opt level: O2

BitMatrix *
ZXing::ParseBitMatrix(BitMatrix *__return_storage_ptr__,string *str,char one,bool expectSpace)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  int x;
  int iVar4;
  int height;
  long lVar5;
  
  uVar1 = std::__cxx11::string::find((char)str,10);
  if (uVar1 == 0xffffffffffffffff) {
    (__return_storage_ptr__->_bits).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->_bits).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    (__return_storage_ptr__->_bits).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    iVar4 = (int)(uVar1 >> (expectSpace & 0x3fU));
    height = (int)(str->_M_string_length / (uVar1 + 1));
    BitMatrix::BitMatrix(__return_storage_ptr__,iVar4,height);
    iVar2 = 0;
    if (0 < iVar4) {
      iVar2 = iVar4;
    }
    for (lVar3 = 0; lVar3 < height; lVar3 = lVar3 + 1) {
      lVar5 = (uVar1 + 1) * lVar3;
      for (iVar4 = 0; iVar2 != iVar4; iVar4 = iVar4 + 1) {
        if ((str->_M_dataplus)._M_p[lVar5] == one) {
          BitMatrix::set(__return_storage_ptr__,iVar4,(int)lVar3,true);
        }
        lVar5 = lVar5 + (ulong)expectSpace + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BitMatrix ParseBitMatrix(const std::string& str, char one, bool expectSpace)
{
	auto lineLength = str.find('\n');
	if (lineLength == std::string::npos)
		return {};

	int strStride = expectSpace ? 2 : 1;
	int height = narrow_cast<int>(str.length() / (lineLength + 1));
	int width = narrow_cast<int>(lineLength / strStride);
	BitMatrix mat(width, height);
	for (int y = 0; y < height; ++y) {
		size_t offset = y * (lineLength + 1);
		for (int x = 0; x < width; ++x, offset += strStride) {
			if (str[offset] == one)
				mat.set(x, y);
		}
	}
	return mat;
}